

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall FlowGraph::CanonicalizeLoops(FlowGraph *this)

{
  bool bVar1;
  ImplicitCallFlags IVar2;
  ImplicitCallFlags IVar3;
  bool bVar4;
  BOOL BVar5;
  JITTimeProfileInfo *this_00;
  Loop *pLStack_28;
  bool relocated;
  Loop *loop_1;
  Loop *pLStack_18;
  bool breakBlockRelocated;
  Loop *loop;
  FlowGraph *this_local;
  
  bVar1 = Func::HasProfileInfo(this->func);
  if (bVar1) {
    this_00 = Func::GetReadOnlyProfileInfo(this->func);
    IVar2 = JITTimeProfileInfo::GetImplicitCallFlags(this_00);
    this->implicitCallFlags = IVar2;
    for (pLStack_18 = this->loopList; pLStack_18 != (Loop *)0x0; pLStack_18 = pLStack_18->next) {
      IVar2 = this->implicitCallFlags;
      IVar3 = Loop::GetImplicitCallFlags(pLStack_18);
      this->implicitCallFlags = IVar2 | IVar3;
    }
  }
  Dump(this,true,L"\n Before canonicalizeLoops \n");
  bVar1 = false;
  for (pLStack_28 = this->loopList; pLStack_28 != (Loop *)0x0; pLStack_28 = pLStack_28->next) {
    Loop::InsertLandingPad(pLStack_28,this);
    BVar5 = Func::HasTry(this->func);
    if ((((BVar5 == 0) || (bVar4 = Func::DoOptimizeTry(this->func), bVar4)) &&
        (bVar4 = Loop::RemoveBreakBlocks(pLStack_28,this), bVar1 == false)) && (bVar4)) {
      bVar1 = true;
    }
  }
  Dump(this,true,L"\n After canonicalizeLoops \n");
  return bVar1;
}

Assistant:

bool
FlowGraph::CanonicalizeLoops()
{
    if (this->func->HasProfileInfo())
    {
        this->implicitCallFlags = this->func->GetReadOnlyProfileInfo()->GetImplicitCallFlags();
        for (Loop *loop = this->loopList; loop; loop = loop->next)
        {
            this->implicitCallFlags = (Js::ImplicitCallFlags)(this->implicitCallFlags | loop->GetImplicitCallFlags());
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n Before canonicalizeLoops \n"));
#endif

    bool breakBlockRelocated = false;

    for (Loop *loop = this->loopList; loop; loop = loop->next)
    {
        loop->InsertLandingPad(this);
        if (!this->func->HasTry() || this->func->DoOptimizeTry())
        {
            bool relocated = loop->RemoveBreakBlocks(this);
            if (!breakBlockRelocated && relocated)
            {
                breakBlockRelocated  = true;
            }
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n After canonicalizeLoops \n"));
#endif

    return breakBlockRelocated;
}